

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_start_domain2(mg_context *ctx,char **options,mg_error_data *error)

{
  uint uVar1;
  int iVar2;
  mg_domain_context *a;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  bool bVar6;
  int local_58;
  int local_54;
  int i;
  int idx;
  mg_domain_context *dom;
  mg_domain_context *new_dom;
  char *default_value;
  char *value;
  char *name;
  mg_error_data *error_local;
  char **options_local;
  mg_context *ctx_local;
  
  if (error != (mg_error_data *)0x0) {
    error->code = 0;
    error->code_sub = 0;
    if (error->text_buffer_size != 0) {
      *error->text = '\0';
    }
  }
  if ((ctx == (mg_context *)0x0) || (options == (char **)0x0)) {
    if (error != (mg_error_data *)0x0) {
      error->code = 1;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Invalid parameters");
    }
    ctx_local._4_4_ = -1;
  }
  else if (ctx->stop_flag == 0) {
    a = (mg_domain_context *)mg_calloc(1,0x200);
    error_local = (mg_error_data *)options;
    if (a == (mg_domain_context *)0x0) {
      if (error != (mg_error_data *)0x0) {
        error->code = 6;
        error->code_sub = 0x200;
        mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                    "Out or memory");
      }
      ctx_local._4_4_ = -6;
    }
    else {
      while( true ) {
        bVar6 = false;
        if (error_local != (mg_error_data *)0x0) {
          value = *(char **)error_local;
          bVar6 = value != (char *)0x0;
          error_local = (mg_error_data *)&error_local->text;
        }
        if (!bVar6) {
          if (a->config[0x1e] == (char *)0x0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,ctx,"mg_start_domain2",0x534f,"%s",
                       "authentication domain required");
            if (error != (mg_error_data *)0x0) {
              error->code = 4;
              error->code_sub = 0x1e;
              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                          "Mandatory option %s missing","authentication_domain");
            }
            mg_free(a);
            return -4;
          }
          local_58 = 0;
          while (config_options[local_58].name != (char *)0x0) {
            pcVar3 = (ctx->dd).config[local_58];
            if ((a->config[local_58] == (char *)0x0) && (pcVar3 != (char *)0x0)) {
              pcVar3 = mg_strdup_ctx(pcVar3,ctx);
              a->config[local_58] = pcVar3;
            }
            local_58 = local_58 + 1;
          }
          a->handlers = (mg_handler_info *)0x0;
          a->next = (mg_domain_context *)0x0;
          a->nonce_count = 0;
          uVar4 = get_random();
          uVar5 = get_random();
          a->auth_nonce_mask = uVar4 ^ uVar5 << 0x1f;
          mg_lock_context(ctx);
          local_54 = 0;
          _i = &ctx->dd;
          while( true ) {
            iVar2 = mg_strcasecmp(a->config[0x1e],_i->config[0x1e]);
            if (iVar2 == 0) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,ctx,"mg_start_domain2",0x538c,
                         "domain %s already in use",a->config[0x1e]);
              if (error != (mg_error_data *)0x0) {
                error->code = 5;
                mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                            "Domain %s specified by %s is already in use",a->config[0x1e],
                            "authentication_domain");
              }
              mg_free(a);
              mg_unlock_context(ctx);
              return -5;
            }
            local_54 = local_54 + 1;
            if (_i->next == (mg_domain_context *)0x0) break;
            _i = _i->next;
          }
          _i->next = a;
          mg_unlock_context(ctx);
          return local_54;
        }
        uVar1 = get_option_index(value);
        if (uVar1 == 0xffffffff) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,ctx,"mg_start_domain2",0x5327,"Invalid option: %s",value);
          if (error != (mg_error_data *)0x0) {
            error->code = 2;
            error->code_sub = 0xffffffff;
            mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                        "Invalid option: %s",value);
          }
          mg_free(a);
          return -2;
        }
        pcVar3 = *(char **)error_local;
        if (pcVar3 == (char *)0x0) break;
        if (a->config[(int)uVar1] != (char *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,ctx,"mg_start_domain2",0x5345,
                     "warning: %s: duplicate option",value);
          mg_free(a->config[(int)uVar1]);
        }
        pcVar3 = mg_strdup_ctx(pcVar3,ctx);
        a->config[(int)uVar1] = pcVar3;
        error_local = (mg_error_data *)&error_local->text;
      }
      mg_cry_internal_wrap
                ((mg_connection *)0x0,ctx,"mg_start_domain2",0x5335,
                 "%s: option value cannot be NULL",value);
      if (error != (mg_error_data *)0x0) {
        error->code = 2;
        error->code_sub = uVar1;
        mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                    "Invalid option value: %s",value);
      }
      mg_free(a);
      ctx_local._4_4_ = -2;
    }
  }
  else {
    if (error != (mg_error_data *)0x0) {
      error->code = 7;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Server already stopped");
    }
    ctx_local._4_4_ = -7;
  }
  return ctx_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_start_domain2(struct mg_context *ctx,
                 const char **options,
                 struct mg_error_data *error)
{
	const char *name;
	const char *value;
	const char *default_value;
	struct mg_domain_context *new_dom;
	struct mg_domain_context *dom;
	int idx, i;

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			*error->text = 0;
		}
	}

	if ((ctx == NULL) || (options == NULL)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_PARAM;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Invalid parameters");
		}
		return -1;
	}

	if (!STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_SERVER_STOPPED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Server already stopped");
		}
		return -7;
	}

	new_dom = (struct mg_domain_context *)
	    mg_calloc_ctx(1, sizeof(struct mg_domain_context), ctx);

	if (!new_dom) {
		/* Out of memory */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)sizeof(struct mg_domain_context);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Out or memory");
		}
		return -6;
	}

	/* Store options - TODO: unite duplicate code */
	while (options && (name = *options++) != NULL) {
		idx = get_option_index(name);
		if (idx == -1) {
			mg_cry_ctx_internal(ctx, "Invalid option: %s", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)-1;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		} else if ((value = *options++) == NULL) {
			mg_cry_ctx_internal(ctx, "%s: option value cannot be NULL", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)idx;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option value: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		}
		if (new_dom->config[idx] != NULL) {
			/* Duplicate option: Later values overwrite earlier ones. */
			mg_cry_ctx_internal(ctx, "warning: %s: duplicate option", name);
			mg_free(new_dom->config[idx]);
		}
		new_dom->config[idx] = mg_strdup_ctx(value, ctx);
		DEBUG_TRACE("[%s] -> [%s]", name, value);
	}

	/* Authentication domain is mandatory */
	/* TODO: Maybe use a new option hostname? */
	if (!new_dom->config[AUTHENTICATION_DOMAIN]) {
		mg_cry_ctx_internal(ctx, "%s", "authentication domain required");
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_MISSING_OPTION;
			error->code_sub = AUTHENTICATION_DOMAIN;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Mandatory option %s missing",
			            config_options[AUTHENTICATION_DOMAIN].name);
		}
		mg_free(new_dom);
		return -4;
	}

	/* Set default value if needed. Take the config value from
	 * ctx as a default value. */
	for (i = 0; config_options[i].name != NULL; i++) {
		default_value = ctx->dd.config[i];
		if ((new_dom->config[i] == NULL) && (default_value != NULL)) {
			new_dom->config[i] = mg_strdup_ctx(default_value, ctx);
		}
	}

	new_dom->handlers = NULL;
	new_dom->next = NULL;
	new_dom->nonce_count = 0;
	new_dom->auth_nonce_mask = get_random() ^ (get_random() << 31);

#if defined(USE_LUA) && defined(USE_WEBSOCKET)
	new_dom->shared_lua_websockets = NULL;
#endif

#if !defined(NO_SSL) && !defined(USE_MBEDTLS)
	if (!init_ssl_ctx(ctx, new_dom)) {
		/* Init SSL failed */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Initializing SSL context failed");
		}
		mg_free(new_dom);
		return -3;
	}
#endif

	/* Add element to linked list. */
	mg_lock_context(ctx);

	idx = 0;
	dom = &(ctx->dd);
	for (;;) {
		if (!mg_strcasecmp(new_dom->config[AUTHENTICATION_DOMAIN],
		                   dom->config[AUTHENTICATION_DOMAIN])) {
			/* Domain collision */
			mg_cry_ctx_internal(ctx,
			                    "domain %s already in use",
			                    new_dom->config[AUTHENTICATION_DOMAIN]);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_DUPLICATE_DOMAIN;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Domain %s specified by %s is already in use",
				            new_dom->config[AUTHENTICATION_DOMAIN],
				            config_options[AUTHENTICATION_DOMAIN].name);
			}
			mg_free(new_dom);
			mg_unlock_context(ctx);
			return -5;
		}

		/* Count number of domains */
		idx++;

		if (dom->next == NULL) {
			dom->next = new_dom;
			break;
		}
		dom = dom->next;
	}

	mg_unlock_context(ctx);

	/* Return domain number */
	return idx;
}